

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  cmOutputConverter *this_00;
  pointer pcVar1;
  cmMakefile *this_01;
  long *plVar2;
  string *psVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view source;
  string_view separator;
  string remove;
  string fc;
  string cleanfile;
  string currentBinDir;
  ofstream fout;
  string local_320;
  undefined1 local_300 [8];
  undefined1 auStack_2f8 [8];
  undefined1 local_2f0 [48];
  undefined1 local_2c0 [24];
  cmLocalUnixMakefileGenerator3 *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  pointer local_290 [2];
  cmGeneratorTarget *local_280;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_278;
  long *local_270;
  _func_int **local_268;
  long local_260 [2];
  string local_250;
  undefined1 local_230 [8];
  long *local_228;
  pointer local_220;
  pointer pSStack_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  char *local_1f8;
  ios_base local_138 [264];
  
  local_2f0._32_8_ = filename;
  local_278 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_270 = local_260;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar1,pcVar1 + psVar3->_M_string_length);
  plVar2 = local_270;
  auStack_2f8 = (undefined1  [8])local_2f0;
  local_300 = (undefined1  [8])&DAT_00000001;
  local_2f0[0] = 0x2f;
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
            (&local_320,this,target);
  local_230 = (undefined1  [8])local_268;
  local_228 = plVar2;
  local_220 = (pointer)local_300;
  pSStack_218 = (pointer)auStack_2f8;
  local_210 = local_320._M_string_length;
  local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p;
  local_200 = 0xc;
  local_1f8 = "/cmake_clean";
  views._M_len = 4;
  views._M_array = (iterator)local_230;
  cmCatViews_abi_cxx11_((string *)&local_2a0,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2f0._32_8_ != (char *)0x0) {
    std::__cxx11::string::append(local_2a0._M_local_buf);
    std::__cxx11::string::append(local_2a0._M_local_buf);
  }
  std::__cxx11::string::append(local_2a0._M_local_buf);
  std::ofstream::ofstream(local_230,(char *)local_2a0._M_allocated_capacity,_S_out);
  if ((*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                   "Could not create ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0);
    cmSystemTools::Error((string *)local_300);
    if (local_300 != (undefined1  [8])local_2f0) {
      operator_delete((void *)local_300,(ulong)(local_2f0._0_8_ + 1));
    }
  }
  if ((files->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"file(REMOVE_RECURSE\n",0x14);
    p_Var5 = (files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(files->_M_t)._M_impl.super__Rb_tree_header;
    local_2a8 = this;
    local_280 = target;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_300,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)(p_Var5 + 1));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  ",2);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)local_300;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_320,(cmOutputConverter *)auStack_2f8,str,(WrapQuotes)filename);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != (undefined1  [8])local_2f0) {
          operator_delete((void *)local_300,(ulong)(local_2f0._0_8_ + 1));
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,")\n",2);
    this = local_2a8;
    target = local_280;
  }
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_250,this_00,(string *)&local_2a0);
  source._M_str = local_250._M_dataplus._M_p;
  source._M_len = local_250._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)(local_2f0 + 0x28),this_00,source,SHELL);
  local_300 = (undefined1  [8])&DAT_00000014;
  auStack_2f8 = (undefined1  [8])0x7df71e;
  local_2f0._0_8_ = local_2c0._0_8_;
  local_2f0._8_8_ = local_2f0._40_8_;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_300;
  cmCatViews_abi_cxx11_(&local_320,views_00);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_2f0._40_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_2c0 + 8)) {
    operator_delete((void *)local_2f0._40_8_,local_2c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_278,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2f0._32_8_ == (char *)0x0) {
    local_2f0._8_8_ = auStack_2f8;
    auStack_2f8 = (undefined1  [8])((ulong)auStack_2f8 & 0xffffffff00000000);
    local_2f0._0_8_ = (cmState *)0x0;
    local_2f0._24_8_ = (pointer)0x0;
    this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_2f0._16_8_ = local_2f0._8_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CMAKE_BUILD_TYPE","");
    psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_320);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_300,psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"# Per-language clean rules from dependency scanning.\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"foreach(lang ",0xd);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_320,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_300,separator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  include(",10);
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (local_2f0 + 0x28,this,target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_2f0._40_8_,local_2c0._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"/cmake_clean_${lang}.cmake OPTIONAL)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"endforeach()\n",0xd);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_2f0._40_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_2c0 + 8)) {
      operator_delete((void *)local_2f0._40_8_,local_2c0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_300);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((pointer *)local_2a0._M_allocated_capacity != local_290) {
    operator_delete((void *)local_2a0._M_allocated_capacity,(long)local_290[0] + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = cmStrCat(
    currentBinDir, '/', this->GetTargetDirectory(target), "/cmake_clean");
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  cmsys::ofstream fout(cleanfile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfile);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeRelativeToCurBinDir(file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(this->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}